

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uri.hpp
# Opt level: O2

string * __thiscall
jsoncons::uri::merge_paths_abi_cxx11_
          (string *__return_storage_ptr__,uri *this,uri *base,uri *relative)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  unsigned_long uVar2;
  unsigned_long uVar3;
  pointer pcVar4;
  size_type sVar5;
  size_t sVar6;
  allocator<char> local_a1;
  string result;
  string local_80;
  string local_60 [32];
  basic_string_view<char,_std::char_traits<char>_> local_40;
  basic_string_view<char,_std::char_traits<char>_> local_30;
  
  paVar1 = &result.field_2;
  result._M_string_length = 0;
  result.field_2._M_local_buf[0] = '\0';
  uVar2 = (this->path_part_).first;
  sVar6 = (this->path_part_).second - uVar2;
  result._M_dataplus._M_p = (pointer)paVar1;
  if (sVar6 == 0 && (this->port_part_).second != (this->userinfo_part_).first) {
    std::__cxx11::string::assign((char *)&result);
  }
  else {
    local_30._M_str = (this->uri_string_)._M_dataplus._M_p + uVar2;
    local_30._M_len = sVar6;
    sVar5 = std::basic_string_view<char,_std::char_traits<char>_>::rfind
                      (&local_30,'/',0xffffffffffffffff);
    local_40 = std::basic_string_view<char,_std::char_traits<char>_>::substr(&local_30,0,sVar5 + 1);
    std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
              (local_60,&local_40,&local_a1);
    std::__cxx11::string::append((string *)&result);
    std::__cxx11::string::~string(local_60);
  }
  uVar2 = (base->path_part_).first;
  uVar3 = (base->path_part_).second;
  if (uVar3 != uVar2) {
    pcVar4 = (base->uri_string_)._M_dataplus._M_p;
    std::__cxx11::string::append<char_const*,void>((string *)&result,pcVar4 + uVar2,pcVar4 + uVar3);
  }
  local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)result._M_dataplus._M_p == paVar1) {
    local_80.field_2._8_8_ = result.field_2._8_8_;
  }
  else {
    local_80._M_dataplus._M_p = result._M_dataplus._M_p;
  }
  local_80.field_2._M_allocated_capacity._1_7_ = result.field_2._M_allocated_capacity._1_7_;
  local_80.field_2._M_local_buf[0] = result.field_2._M_local_buf[0];
  local_80._M_string_length = result._M_string_length;
  result._M_string_length = 0;
  result.field_2._M_local_buf[0] = '\0';
  result._M_dataplus._M_p = (pointer)paVar1;
  remove_dot_segments(__return_storage_ptr__,&local_80);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::~string((string *)&result);
  return __return_storage_ptr__;
}

Assistant:

static std::string merge_paths(const uri& base, const uri& relative)
        {
            std::string result;
            
            if (!base.encoded_authority().empty() && base.encoded_path().empty()) 
            {
                result = "/";
                //result.append(relative.encoded_path().data(), relative.encoded_path().length());
            } 
            else 
            {
                const auto& base_path = base.encoded_path();
                auto last_slash = base_path.rfind('/');
                result.append(std::string(base_path.substr(0,last_slash+1)));
            }
            if (!relative.encoded_path().empty()) 
            {
                result.append(relative.encoded_path().begin(), relative.encoded_path().end());
            }
            return remove_dot_segments(std::move(result));
        }